

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

void __thiscall
iutest::detail::PairMatcher<iutest::detail::AnythingMatcher,_iutest::detail::NeMatcher<int>_>::
~PairMatcher(PairMatcher<iutest::detail::AnythingMatcher,_iutest::detail::NeMatcher<int>_> *this)

{
  PairMatcher<iutest::detail::AnythingMatcher,_iutest::detail::NeMatcher<int>_> *this_local;
  
  ~PairMatcher(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

class PairMatcher IUTEST_CXX_FINAL : public IMatcher
{
public:
    PairMatcher(const T1& m1, const T2& m2) : m_m1(m1), m_m2(m2) {}

public:
    template<typename U>
    AssertionResult operator ()(const U& actual)
    {
        if IUTEST_COND_UNLIKELY( !CheckElem(actual.first, m_m1) )
        {
            return AssertionFailure() << WhichIs();
        }
        if IUTEST_COND_UNLIKELY( !CheckElem(actual.second, m_m2) )
        {
            return AssertionFailure() << WhichIs();
        }
        return AssertionSuccess();
    }